

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBblif.c
# Opt level: O0

void Bbl_ManDfs_rec(Bbl_Obj_t *pObj,Vec_Ptr_t *vNodes)

{
  int iVar1;
  Bbl_Obj_t *local_20;
  Bbl_Obj_t *pFanin;
  Vec_Ptr_t *vNodes_local;
  Bbl_Obj_t *pObj_local;
  
  iVar1 = Bbl_ObjIsMarked(pObj);
  if ((iVar1 == 0) && (iVar1 = Bbl_ObjIsInput(pObj), iVar1 == 0)) {
    for (local_20 = Bbl_ObjFaninFirst(pObj); local_20 != (Bbl_Obj_t *)0x0;
        local_20 = Bbl_ObjFaninNext(pObj,local_20)) {
      Bbl_ManDfs_rec(local_20,vNodes);
    }
    iVar1 = Bbl_ObjIsMarked(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Bbl_ObjIsMarked(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/io/ioReadBblif.c"
                    ,0x70,"void Bbl_ManDfs_rec(Bbl_Obj_t *, Vec_Ptr_t *)");
    }
    Bbl_ObjMark(pObj);
    Vec_PtrPush(vNodes,pObj);
  }
  return;
}

Assistant:

void Bbl_ManDfs_rec( Bbl_Obj_t * pObj, Vec_Ptr_t * vNodes )
{
    extern void Bbl_ObjMark( Bbl_Obj_t * p );
    extern int  Bbl_ObjIsMarked( Bbl_Obj_t * p );
    Bbl_Obj_t * pFanin;
    if ( Bbl_ObjIsMarked(pObj) || Bbl_ObjIsInput(pObj) )
        return;
    Bbl_ObjForEachFanin( pObj, pFanin )
        Bbl_ManDfs_rec( pFanin, vNodes );
    assert( !Bbl_ObjIsMarked(pObj) ); // checks if acyclic
    Bbl_ObjMark( pObj );
    Vec_PtrPush( vNodes, pObj );
}